

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise1d.cpp
# Opt level: O0

int __thiscall
ncnn::DeconvolutionDepthWise1D::forward
          (DeconvolutionDepthWise1D *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  int ret;
  Mat top_blob_bordered;
  int outw;
  int kernel_extent_w;
  int w;
  Mat *_bias_data;
  Mat bias_data_flattened;
  int k;
  int j;
  int i;
  float *wg;
  float *wg2;
  int g;
  int maxk;
  int inch_g;
  int outch_g;
  Mat weight_data_transposed;
  Mat weight_data_flattened;
  int _num_output;
  int _kernel_w;
  int _num_input;
  Mat *top_blob;
  Mat *_weight_data;
  Mat *bottom_blob;
  undefined4 in_stack_fffffffffffffb58;
  undefined4 in_stack_fffffffffffffb5c;
  size_t in_stack_fffffffffffffb60;
  undefined8 in_stack_fffffffffffffb68;
  int _w;
  Mat *in_stack_fffffffffffffb70;
  void **ppvVar1;
  Option *in_stack_fffffffffffffb80;
  Mat *in_stack_fffffffffffffb88;
  undefined8 *puVar2;
  Mat *in_stack_fffffffffffffb90;
  bool local_3a1;
  void *__ptr;
  int *piVar3;
  void *local_250;
  int *local_248;
  undefined8 local_240;
  undefined4 local_238;
  long *local_230;
  undefined4 local_228;
  undefined4 local_224;
  undefined4 local_220;
  undefined4 local_21c;
  int local_218;
  long local_210;
  int local_204;
  int local_200;
  int local_1fc;
  reference local_1f8;
  const_reference local_1f0;
  const_reference local_1e8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_1d8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_1d0;
  int local_1bc;
  void **local_1b8;
  undefined1 *local_1b0;
  undefined8 *local_178;
  void **local_168;
  undefined1 *local_120;
  void **local_118;
  int local_e0;
  undefined4 local_dc;
  void **local_d8;
  int local_c0;
  undefined4 local_bc;
  undefined8 *local_b8;
  void *local_40;
  void **local_28;
  undefined1 *local_20;
  
  _w = (int)((ulong)in_stack_fffffffffffffb68 >> 0x20);
  local_1d8 = in_RDX;
  local_1d0 = in_RSI;
  local_1e8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_1f0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_1d0,1);
  local_1f8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_1d8,0);
  local_1fc = local_1e8->h;
  local_200 = local_1f0->w;
  local_204 = local_1f0->h * *(int *)(in_RDI + 0xf8);
  local_1b8 = &local_250;
  local_250 = (void *)0x0;
  local_248 = (int *)0x0;
  local_240 = 0;
  local_238 = 0;
  local_230 = (long *)0x0;
  local_228 = 0;
  local_224 = 0;
  local_220 = 0;
  local_21c = 0;
  local_218 = 0;
  local_210 = 0;
  flatten(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  local_118 = &local_250;
  if (local_250 != (void *)0x0) {
    local_28 = local_118;
  }
  local_3a1 = local_250 != (void *)0x0 && local_210 * local_218 != 0;
  if (local_3a1) {
    local_1b0 = &stack0xfffffffffffffd58;
    __ptr = (void *)0x0;
    piVar3 = (int *)0x0;
    Mat::create(in_stack_fffffffffffffb70,_w,in_stack_fffffffffffffb60,
                (Allocator *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
    local_120 = &stack0xfffffffffffffd58;
    if (__ptr != (void *)0x0) {
      local_20 = local_120;
    }
    local_1bc = -100;
    puVar2 = (undefined8 *)&stack0xfffffffffffffd58;
    local_178 = puVar2;
    local_b8 = puVar2;
    if (piVar3 != (int *)0x0) {
      local_bc = 0xffffffff;
      LOCK();
      local_c0 = *piVar3;
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if ((local_c0 == 1) && (__ptr != (void *)0x0)) {
        free(__ptr);
      }
    }
    *puVar2 = 0;
    puVar2[2] = 0;
    *(undefined4 *)(puVar2 + 3) = 0;
    *(undefined4 *)(puVar2 + 5) = 0;
    *(undefined4 *)((long)puVar2 + 0x2c) = 0;
    *(undefined4 *)(puVar2 + 6) = 0;
    *(undefined4 *)((long)puVar2 + 0x34) = 0;
    *(undefined4 *)(puVar2 + 7) = 0;
    puVar2[8] = 0;
    puVar2[1] = 0;
  }
  else {
    local_1bc = -100;
  }
  ppvVar1 = &local_250;
  if (local_248 != (int *)0x0) {
    local_dc = 0xffffffff;
    LOCK();
    local_e0 = *local_248;
    *local_248 = *local_248 + -1;
    UNLOCK();
    if (local_e0 == 1) {
      local_168 = ppvVar1;
      local_d8 = ppvVar1;
      if (local_230 == (long *)0x0) {
        local_40 = local_250;
        if (local_250 != (void *)0x0) {
          free(local_250);
        }
      }
      else {
        (**(code **)(*local_230 + 0x18))(local_230,local_250);
      }
    }
  }
  *ppvVar1 = (void *)0x0;
  ppvVar1[2] = (void *)0x0;
  *(undefined4 *)(ppvVar1 + 3) = 0;
  *(undefined4 *)(ppvVar1 + 5) = 0;
  *(undefined4 *)((long)ppvVar1 + 0x2c) = 0;
  *(undefined4 *)(ppvVar1 + 6) = 0;
  *(undefined4 *)((long)ppvVar1 + 0x34) = 0;
  *(undefined4 *)(ppvVar1 + 7) = 0;
  ppvVar1[8] = (void *)0x0;
  ppvVar1[1] = (void *)0x0;
  return local_1bc;
}

Assistant:

int DeconvolutionDepthWise1D::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& _weight_data = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int _num_input = bottom_blob.h;
    const int _kernel_w = _weight_data.w;
    const int _num_output = _weight_data.h * group;

    Mat weight_data_flattened;
    flatten(_weight_data, weight_data_flattened, opt);
    if (weight_data_flattened.empty())
        return -100;

    // transpose group-inch/group-outch/group-kw to group-outch/group-inch/group-kw
    Mat weight_data_transposed;
    {
        weight_data_transposed.create(_kernel_w * _num_output * _num_input / group, 4u, opt.workspace_allocator);
        if (weight_data_transposed.empty())
            return -100;

        const int outch_g = _num_output / group;
        const int inch_g = _num_input / group;
        const int maxk = _kernel_w;

        for (int g = 0; g < group; g++)
        {
            // reorder weight from inch-outch to outch-inch
            float* wg2 = (float*)weight_data_transposed + g * outch_g * inch_g * maxk;
            const float* wg = (const float*)weight_data_flattened + g * inch_g * outch_g * maxk;
            for (int i = 0; i < outch_g; i++)
            {
                for (int j = 0; j < inch_g; j++)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        wg2[(i * inch_g + j) * maxk + k] = wg[(j * outch_g + i) * maxk + k];
                    }
                }
            }
        }
    }

    Mat bias_data_flattened;
    if (bias_term)
    {
        const Mat& _bias_data = bottom_blobs[2];
        flatten(_bias_data, bias_data_flattened, opt);
        if (bias_data_flattened.empty())
            return -100;
    }

    const int w = bottom_blob.w;

    const int kernel_extent_w = dilation_w * (_kernel_w - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || output_w > 0)
    {
        top_blob_bordered.create(outw, _num_output, 4u, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, _num_output, 4u, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    int ret = deconvolutiondepthwise1d(bottom_blob, top_blob_bordered, weight_data_transposed, bias_data_flattened, _kernel_w, stride_w, dilation_w, group, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}